

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O2

void __thiscall
OSTEI_HRR_Algorithm_Base::Create
          (OSTEI_HRR_Algorithm_Base *this,QAM *am,RRStepType brasteptype,RRStepType ketsteptype)

{
  initializer_list<QAM> __l;
  allocator_type local_82;
  less<QAM> local_81;
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_80;
  undefined1 local_50 [48];
  
  QAM::QAM((QAM *)local_50,am);
  __l._M_len = 1;
  __l._M_array = (QAM *)local_50;
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::set
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)&local_80,__l,&local_81,&local_82);
  Create(this,(set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)&local_80,brasteptype,ketsteptype);
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_80);
  std::__cxx11::string::~string((string *)(local_50 + 0x10));
  return;
}

Assistant:

void OSTEI_HRR_Algorithm_Base::Create(QAM am,
                                      RRStepType brasteptype,
                                      RRStepType ketsteptype)
{
    Create(std::set<QAM>{am}, brasteptype, ketsteptype);
}